

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::scrollContentsBy(QTreeView *this,int dx,int dy)

{
  QTreeViewPrivate *this_00;
  QHeaderViewPrivate *this_01;
  QWidgetData *pQVar1;
  Data *pDVar2;
  LayoutDirection LVar3;
  int iVar4;
  ScrollMode SVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  QScrollBar *pQVar9;
  long lVar10;
  QWidget *this_02;
  QPoint QVar11;
  uint uVar12;
  uint uVar13;
  int i;
  long lVar14;
  int local_34;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QBasicTimer::stop();
  LVar3 = QWidget::layoutDirection((QWidget *)this);
  if (dx == 0) {
    local_34 = 0;
  }
  else {
    local_34 = -dx;
    if (LVar3 != RightToLeft) {
      local_34 = dx;
    }
    iVar4 = QHeaderView::offset(this_00->header);
    this_01 = *(QHeaderViewPrivate **)
               &(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                super_QWidget.field_0x8;
    pQVar9 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    SVar5 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    QHeaderViewPrivate::setScrollOffset(this_01,pQVar9,SVar5);
    SVar5 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    if (SVar5 == ScrollPerItem) {
      iVar6 = QHeaderView::offset(this_00->header);
      LVar3 = QWidget::layoutDirection((QWidget *)this);
      local_34 = iVar4 - iVar6;
      if (LVar3 == RightToLeft) {
        local_34 = iVar6 - iVar4;
      }
    }
  }
  iVar4 = this_00->defaultItemHeight;
  if (iVar4 < 1) {
    iVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x1f8))(this,0);
  }
  lVar14 = (this_00->viewItems).d.size;
  if (iVar4 != 0 && lVar14 != 0) {
    pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    lVar10 = (long)((((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1) / iVar4);
    if (lVar14 < lVar10) {
      lVar10 = lVar14;
    }
    uVar12 = -dy;
    if (0 < dy) {
      uVar12 = dy;
    }
    uVar7 = (uint)lVar10;
    uVar13 = -uVar7;
    if (0 < (int)uVar7) {
      uVar13 = uVar7;
    }
    if ((uVar13 < uVar12) &&
       ((pDVar2 = (this_00->super_QAbstractItemViewPrivate).editorIndexHash.d, pDVar2 == (Data *)0x0
        || (pDVar2->size == 0)))) {
      this_02 = (QWidget *)QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QWidget::update(this_02);
      QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      viewport);
      return;
    }
    if (dy == 0) {
      dy = 0;
    }
    else {
      SVar5 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
      if (SVar5 == ScrollPerItem) {
        pQVar9 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        iVar4 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
        lVar14 = (long)(iVar4 + dy);
        if (dy < 0) {
          dy = 0;
          do {
            if (lVar14 < (this_00->viewItems).d.size) {
              iVar6 = QTreeViewPrivate::itemHeight(this_00,(int)lVar14);
              dy = dy - iVar6;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < iVar4);
        }
        else {
          iVar6 = iVar4 + dy;
          dy = 0;
          do {
            iVar6 = iVar6 + -1;
            if (lVar14 <= (this_00->viewItems).d.size) {
              iVar8 = QTreeViewPrivate::itemHeight(this_00,iVar6);
              dy = dy + iVar8;
            }
            lVar14 = lVar14 + -1;
          } while (iVar4 < lVar14);
        }
      }
    }
    QVar11.xp.m_i = -local_34;
    QVar11.yp.m_i = -dy;
    (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset = QVar11;
    QAbstractItemViewPrivate::updateDirtyRegion(&this_00->super_QAbstractItemViewPrivate);
    (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset.xp = 0;
    (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset.yp = 0;
    QWidget::scroll((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                    viewport,local_34,dy);
    return;
  }
  return;
}

Assistant:

void QTreeView::scrollContentsBy(int dx, int dy)
{
    Q_D(QTreeView);

    d->delayedAutoScroll.stop(); // auto scroll was canceled by the user scrolling

    dx = isRightToLeft() ? -dx : dx;
    if (dx) {
        int oldOffset = d->header->offset();
        d->header->d_func()->setScrollOffset(horizontalScrollBar(), horizontalScrollMode());
        if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->header->offset();
            dx = isRightToLeft() ? newOffset - oldOffset : oldOffset - newOffset;
        }
    }

    const int itemHeight = d->defaultItemHeight <= 0 ? sizeHintForRow(0) : d->defaultItemHeight;
    if (d->viewItems.isEmpty() || itemHeight == 0)
        return;

    // guestimate the number of items in the viewport
    int viewCount = d->viewport->height() / itemHeight;
    int maxDeltaY = qMin(d->viewItems.size(), viewCount);
    // no need to do a lot of work if we are going to redraw the whole thing anyway
    if (qAbs(dy) > qAbs(maxDeltaY) && d->editorIndexHash.isEmpty()) {
        verticalScrollBar()->update();
        d->viewport->update();
        return;
    }

    if (dy && verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int currentScrollbarValue = verticalScrollBar()->value();
        int previousScrollbarValue = currentScrollbarValue + dy; // -(-dy)
        int currentViewIndex = currentScrollbarValue; // the first visible item
        int previousViewIndex = previousScrollbarValue;
        dy = 0;
        if (previousViewIndex < currentViewIndex) { // scrolling down
            for (int i = previousViewIndex; i < currentViewIndex; ++i) {
                if (i < d->viewItems.size())
                    dy -= d->itemHeight(i);
            }
        } else if (previousViewIndex > currentViewIndex) { // scrolling up
            for (int i = previousViewIndex - 1; i >= currentViewIndex; --i) {
                if (i < d->viewItems.size())
                    dy += d->itemHeight(i);
            }
        }
    }

    d->scrollContentsBy(dx, dy);
}